

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::sshl_ov(APInt *this,APInt *ShAmt,bool *Overflow)

{
  bool bVar1;
  uint uVar2;
  byte *in_RCX;
  undefined8 extraout_RDX;
  APInt AVar4;
  bool *Overflow_local;
  APInt *ShAmt_local;
  APInt *this_local;
  undefined8 uVar3;
  
  uVar2 = getBitWidth(ShAmt);
  bVar1 = uge((APInt *)Overflow,(ulong)uVar2);
  *in_RCX = bVar1;
  if ((*in_RCX & 1) == 0) {
    bVar1 = isNonNegative(ShAmt);
    if (bVar1) {
      uVar2 = countLeadingZeros(ShAmt);
      bVar1 = uge((APInt *)Overflow,(ulong)uVar2);
      *in_RCX = bVar1;
    }
    else {
      uVar2 = countLeadingOnes(ShAmt);
      bVar1 = uge((APInt *)Overflow,(ulong)uVar2);
      *in_RCX = bVar1;
    }
    AVar4 = operator<<(this,ShAmt);
    uVar3 = AVar4._8_8_;
  }
  else {
    APInt(this,ShAmt->BitWidth,0,false);
    uVar3 = extraout_RDX;
  }
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::sshl_ov(const APInt &ShAmt, bool &Overflow) const {
  Overflow = ShAmt.uge(getBitWidth());
  if (Overflow)
    return APInt(BitWidth, 0);

  if (isNonNegative()) // Don't allow sign change.
    Overflow = ShAmt.uge(countLeadingZeros());
  else
    Overflow = ShAmt.uge(countLeadingOnes());

  return *this << ShAmt;
}